

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalMaterializedCTE::Deserialize(LogicalMaterializedCTE *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  LogicalMaterializedCTE *this_00;
  pointer pLVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::LogicalMaterializedCTE_*,_false> local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  idx_t iVar4;
  
  this_00 = (LogicalMaterializedCTE *)operator_new(0x98);
  LogicalOperator::LogicalOperator((LogicalOperator *)this_00,LOGICAL_MATERIALIZED_CTE);
  (this_00->super_LogicalOperator)._vptr_LogicalOperator =
       (_func_int **)&PTR__LogicalMaterializedCTE_0197f140;
  (this_00->ctename)._M_dataplus._M_p = (pointer)&(this_00->ctename).field_2;
  (this_00->ctename)._M_string_length = 0;
  (this_00->ctename).field_2._M_local_buf[0] = '\0';
  local_58._M_head_impl = this_00;
  pLVar3 = unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
                         *)&local_58);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"table_index");
  if ((char)uVar1 == '\0') {
    iVar4 = 0;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar4 = CONCAT44(extraout_var,iVar2);
  }
  pLVar3->table_index = iVar4;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  pLVar3 = unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
                         *)&local_58);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"column_count");
  if ((char)uVar1 == '\0') {
    iVar4 = 0;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar4 = CONCAT44(extraout_var_00,iVar2);
  }
  pLVar3->column_count = iVar4;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  pLVar3 = unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalMaterializedCTE,_std::default_delete<duckdb::LogicalMaterializedCTE>,_true>
                         *)&local_58);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xca,"ctename");
  if ((char)uVar1 == '\0') {
    local_48 = 0;
    local_40[0] = 0;
    local_50 = local_40;
    ::std::__cxx11::string::operator=((string *)&pLVar3->ctename,(string *)&local_50);
    if (local_50 == local_40) goto LAB_005bc18a;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
    ::std::__cxx11::string::operator=((string *)&pLVar3->ctename,(string *)&local_50);
    if (local_50 == local_40) goto LAB_005bc18a;
  }
  operator_delete(local_50);
LAB_005bc18a:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalMaterializedCTE::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<LogicalMaterializedCTE>(new LogicalMaterializedCTE());
	deserializer.ReadPropertyWithDefault<idx_t>(200, "table_index", result->table_index);
	deserializer.ReadPropertyWithDefault<idx_t>(201, "column_count", result->column_count);
	deserializer.ReadPropertyWithDefault<string>(202, "ctename", result->ctename);
	return std::move(result);
}